

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O0

int check_fs(test_state *state)

{
  ulong uVar1;
  long in_RDI;
  uchar *tmp;
  int size;
  int status;
  int iVar2;
  undefined4 in_stack_ffffffffffffffec;
  int local_4;
  
  iVar2 = *(int *)(in_RDI + 0xc);
  if ((*(uint *)(*(long *)(in_RDI + 0x58) + 0x3c) & 8) == 0) {
    for (uVar1 = *(ulong *)(in_RDI + 0x10);
        uVar1 < (ulong)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x30));
        uVar1 = uVar1 + (long)(iVar2 << 2)) {
      (**(code **)(in_RDI + 0x50))(uVar1,0,iVar2);
      (**(code **)(in_RDI + 0x50))(uVar1 + (long)iVar2,0,iVar2);
      (**(code **)(in_RDI + 0x50))(uVar1 + (long)(iVar2 << 1),0,iVar2);
      (**(code **)(in_RDI + 0x50))(uVar1 + (long)(iVar2 * 3),4,iVar2);
    }
  }
  else {
    for (uVar1 = *(ulong *)(in_RDI + 0x10);
        uVar1 < (ulong)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x30));
        uVar1 = uVar1 + (long)(iVar2 << 2)) {
      (**(code **)(in_RDI + 0x50))(uVar1,*(long *)(in_RDI + 0x48) + 2,iVar2);
      (**(code **)(in_RDI + 0x50))(uVar1 + (long)iVar2,*(undefined8 *)(in_RDI + 0x48),iVar2);
      (**(code **)(in_RDI + 0x50))(uVar1 + (long)(iVar2 << 1),*(undefined8 *)(in_RDI + 0x48),iVar2);
      (**(code **)(in_RDI + 0x50))(uVar1 + (long)(iVar2 * 3),*(undefined8 *)(in_RDI + 0x48),iVar2);
    }
  }
  printf("Checking FS ... ");
  local_4 = check_block_sizes((test_state *)CONCAT44(in_stack_ffffffffffffffec,iVar2),
                              (int)(uVar1 >> 0x20),(int)uVar1);
  if (local_4 == 0) {
    printf("%s\n","\x1b[0;32mPASS\x1b[0m");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int check_fs(struct test_state *state)
{
    int status, size;
    unsigned char *tmp;

    size = state->bytes_per_sample;

    if (state->strm->flags & AEC_DATA_PREPROCESS) {
        for (tmp = state->ubuf;
             tmp < state->ubuf + state->buf_len;
             tmp += 4 * size) {
            state->out(tmp, state->xmin + 2, size);
            state->out(tmp + size, state->xmin, size);
            state->out(tmp + 2 * size, state->xmin, size);
            state->out(tmp + 3 * size, state->xmin, size);
        }
    } else {
        for (tmp = state->ubuf;
             tmp < state->ubuf + state->buf_len;
             tmp += 4 * size) {
            state->out(tmp, 0, size);
            state->out(tmp + size, 0, size);
            state->out(tmp + 2 * size, 0, size);
            state->out(tmp + 3 * size, 4, size);
        }
    }

    printf("Checking FS ... ");
    status = check_block_sizes(state, 1, state->id_len);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}